

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_parse.c
# Opt level: O1

int parse_course_status(course_status *status,char *str)

{
  int iVar1;
  course_status cVar2;
  
  iVar1 = strncmp(str,"OPEN",4);
  if (iVar1 == 0) {
    cVar2 = STATUS_OPEN;
  }
  else {
    iVar1 = strncmp(str,"CLOSE",5);
    if (iVar1 == 0) {
      cVar2 = STATUS_CLOSED;
    }
    else {
      iVar1 = strncmp(str,"CANCEL",6);
      if (iVar1 != 0) {
        return -1;
      }
      cVar2 = STATUS_CANCELLED;
    }
  }
  *status = cVar2;
  return 0;
}

Assistant:

int parse_course_status(enum course_status *status, const char *str)
{
	if (!strncmp(str, "OPEN", 4)) {
		*status = STATUS_OPEN;
	} else if (!strncmp(str, "CLOSE", 5)) {
		*status = STATUS_CLOSED;
	} else if (!strncmp(str, "CANCEL", 6)) {
		*status = STATUS_CANCELLED;
	} else {
		return -1;
	}

	return 0;
}